

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListAndAPITest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBStrideOfEmptyListAndAPITest *this,
          GLuint test_case_index)

{
  TestError *this_00;
  GLuint test_case_index_local;
  XFBStrideOfEmptyListAndAPITest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (test_case_index == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Valid case");
  }
  else if (test_case_index == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Missing xfb at index 0");
  }
  else {
    if (test_case_index != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x4ff3);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Missing xfb at index 1");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFBStrideOfEmptyListAndAPITest::getTestCaseName(GLuint test_case_index)
{
	std::string result;

	switch (test_case_index)
	{
	case VALID:
		result = "Valid case";
		break;
	case FIRST_MISSING:
		result = "Missing xfb at index 0";
		break;
	case SECOND_MISSING:
		result = "Missing xfb at index 1";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}